

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

optional<Coin> * __thiscall
node::anon_unknown_2::NodeImpl::getUnspentOutput
          (optional<Coin> *__return_storage_ptr__,NodeImpl *this,COutPoint *output)

{
  undefined8 uVar1;
  int iVar2;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar3;
  Chainstate *this_00;
  CCoinsViewCache *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  unique_lock<std::recursive_mutex> local_60;
  CTxOut local_50;
  undefined4 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_60._M_device = &cs_main.super_recursive_mutex;
  local_60._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_60);
  CTxOut::CTxOut(&local_50);
  uStack_28 = 0;
  puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_context->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x1a6,"chainman","m_context->chainman");
  this_00 = ChainstateManager::ActiveChainstate
                      ((puVar3->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar4 = Chainstate::CoinsTip(this_00);
  iVar2 = (**(pCVar4->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView)
                    (pCVar4,output,&local_50);
  if ((char)iVar2 == '\0') {
    (__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
    super__Optional_payload<Coin,_true,_false,_false>.super__Optional_payload_base<Coin>._M_engaged
         = false;
    if (0x1c < local_50.scriptPubKey.super_CScriptBase._size) {
      free(local_50.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    }
  }
  else {
    (__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
    super__Optional_payload<Coin,_true,_false,_false>.super__Optional_payload_base<Coin>._M_payload.
    _M_value.out.nValue = local_50.nValue;
    (__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
    super__Optional_payload<Coin,_true,_false,_false>.super__Optional_payload_base<Coin>._M_payload.
    _M_value.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
         local_50.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
                      super__Optional_payload<Coin,_true,_false,_false>.
                      super__Optional_payload_base<Coin>._M_payload._M_value.out.scriptPubKey.
                      super_CScriptBase._union + 8) =
         CONCAT44(local_50.scriptPubKey.super_CScriptBase._union._12_4_,
                  local_50.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity);
    *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
                      super__Optional_payload<Coin,_true,_false,_false>.
                      super__Optional_payload_base<Coin>._M_payload._M_value.out.scriptPubKey.
                      super_CScriptBase._union + 0xc) =
         CONCAT44(local_50.scriptPubKey.super_CScriptBase._union._16_4_,
                  local_50.scriptPubKey.super_CScriptBase._union._12_4_);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
             super__Optional_payload<Coin,_true,_false,_false>.super__Optional_payload_base<Coin>.
             _M_payload._M_value.out.scriptPubKey.super_CScriptBase._union + 0x14) =
         local_50.scriptPubKey.super_CScriptBase._union._20_8_;
    uVar1 = CONCAT44(uStack_28,local_50.scriptPubKey.super_CScriptBase._size);
    local_50.scriptPubKey.super_CScriptBase._size = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
      super__Optional_payload<Coin,_true,_false,_false>.super__Optional_payload_base<Coin>.
      _M_payload._M_value.out.scriptPubKey.super_CScriptBase._size = uVar1;
    (__return_storage_ptr__->super__Optional_base<Coin,_false,_false>)._M_payload.
    super__Optional_payload<Coin,_true,_false,_false>.super__Optional_payload_base<Coin>._M_engaged
         = true;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Coin> getUnspentOutput(const COutPoint& output) override
    {
        LOCK(::cs_main);
        Coin coin;
        if (chainman().ActiveChainstate().CoinsTip().GetCoin(output, coin)) return coin;
        return {};
    }